

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O2

void __thiscall Assimp::AMFImporter::ParseNode_Vertex(AMFImporter *this)

{
  bool bVar1;
  int iVar2;
  CAMFImporter_NodeElement *pNode;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  allocator<char> local_82;
  allocator<char> local_81;
  uint local_80;
  uint local_7c;
  string local_78;
  CAMFImporter_NodeElement *ne;
  string local_50;
  
  pNode = (CAMFImporter_NodeElement *)operator_new(0x50);
  CAMFImporter_NodeElement_Vertex::CAMFImporter_NodeElement_Vertex
            ((CAMFImporter_NodeElement_Vertex *)pNode,this->mNodeElement_Cur);
  ne = pNode;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    ParseHelper_Node_Enter(this,pNode);
    local_7c = 0;
    local_80 = 0;
    do {
      do {
        while( true ) {
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar2 == '\0') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_78,"vertex",(allocator<char> *)&local_50);
            Throw_CloseNotFound(this,&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            goto LAB_003c6c34;
          }
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) break;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"color",(allocator<char> *)&local_50);
          bVar1 = XML_CheckNode_NameEqual(this,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          if (bVar1) {
            if ((local_7c & 1) != 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_78,"color",&local_81);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,"Only one color can be defined for <vertex>.",&local_82
                        );
              Throw_MoreThanOnceDefined(this,&local_78,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_78);
            }
            ParseNode_Color(this);
            local_7c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_78,"coordinates",(allocator<char> *)&local_50);
            bVar1 = XML_CheckNode_NameEqual(this,&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            if (bVar1) {
              if ((local_80 & 1) != 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_78,"coordinates",&local_81);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_50,
                           "Only one coordinates set can be defined for <vertex>.",&local_82);
                Throw_MoreThanOnceDefined(this,&local_78,&local_50);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&local_78);
              }
              ParseNode_Coordinates(this);
              local_80 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_78,"metadata",(allocator<char> *)&local_50);
              bVar1 = XML_CheckNode_NameEqual(this,&local_78);
              std::__cxx11::string::~string((string *)&local_78);
              if (bVar1) {
                ParseNode_Metadata(this);
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_78,"vertex",(allocator<char> *)&local_50);
                XML_CheckNode_SkipUnsupported(this,&local_78);
                std::__cxx11::string::~string((string *)&local_78);
              }
            }
          }
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"vertex",(allocator<char> *)&local_50);
      bVar1 = XML_CheckNode_NameEqual(this,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    } while (!bVar1);
LAB_003c6c34:
    ParseHelper_Node_Exit(this);
  }
  else {
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    push_back(&this->mNodeElement_Cur->Child,&ne);
  }
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_List,&ne);
  return;
}

Assistant:

void AMFImporter::ParseNode_Vertex()
{
CAMFImporter_NodeElement* ne;

	// create new mesh object.
	ne = new CAMFImporter_NodeElement_Vertex(mNodeElement_Cur);
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool col_read = false;
		bool coord_read = false;

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("vertex");
			if(XML_CheckNode_NameEqual("color"))
			{
				// Check if data already defined.
				if(col_read) Throw_MoreThanOnceDefined("color", "Only one color can be defined for <vertex>.");
				// read data and set flag about it
				ParseNode_Color();
				col_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("coordinates"))
			{
				// Check if data already defined.
				if(coord_read) Throw_MoreThanOnceDefined("coordinates", "Only one coordinates set can be defined for <vertex>.");
				// read data and set flag about it
				ParseNode_Coordinates();
				coord_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("metadata")) { ParseNode_Metadata(); continue; }
		MACRO_NODECHECK_LOOPEND("vertex");
		ParseHelper_Node_Exit();
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}